

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlValidateAttributeValue2
              (xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlChar *name,xmlAttributeType type,xmlChar *value
              )

{
  byte bVar1;
  int iVar2;
  byte *name_00;
  byte *pbVar3;
  xmlEntityPtr pxVar4;
  bool bVar5;
  xmlNotationPtr local_78;
  xmlNotationPtr nota;
  xmlEntityPtr ent_1;
  byte *pbStack_60;
  xmlChar save;
  xmlChar *cur;
  xmlChar *nam;
  xmlChar *dup;
  xmlEntityPtr ent;
  int ret;
  xmlChar *value_local;
  xmlAttributeType type_local;
  xmlChar *name_local;
  xmlDocPtr doc_local;
  xmlValidCtxtPtr ctxt_local;
  
  ent._4_4_ = 1;
  switch(type) {
  case XML_ATTRIBUTE_CDATA:
  case XML_ATTRIBUTE_ID:
  case XML_ATTRIBUTE_IDREF:
  case XML_ATTRIBUTE_IDREFS:
  case XML_ATTRIBUTE_NMTOKEN:
  case XML_ATTRIBUTE_NMTOKENS:
  case XML_ATTRIBUTE_ENUMERATION:
    break;
  case XML_ATTRIBUTE_ENTITY:
    dup = (xmlChar *)xmlGetDocEntity(doc,value);
    if (((xmlEntityPtr)dup == (xmlEntityPtr)0x0) && (doc->standalone == 1)) {
      doc->standalone = 0;
      dup = (xmlChar *)xmlGetDocEntity(doc,value);
    }
    if (dup == (xmlChar *)0x0) {
      xmlErrValidNode(ctxt,(xmlNodePtr)doc,XML_DTD_UNKNOWN_ENTITY,
                      "ENTITY attribute %s reference an unknown entity \"%s\"\n",name,value,
                      (xmlChar *)0x0);
      ent._4_4_ = 0;
    }
    else {
      iVar2 = *(int *)(dup + 0x5c);
      if (iVar2 != 3) {
        xmlErrValidNode(ctxt,(xmlNodePtr)doc,XML_DTD_ENTITY_TYPE,
                        "ENTITY attribute %s reference an entity \"%s\" of wrong type\n",name,value,
                        (xmlChar *)0x0);
      }
      ent._4_4_ = (uint)(iVar2 == 3);
    }
    break;
  case XML_ATTRIBUTE_ENTITIES:
    pbVar3 = xmlStrdup(value);
    pbStack_60 = pbVar3;
    if (pbVar3 == (byte *)0x0) {
      return 0;
    }
    while (name_00 = pbStack_60, *pbStack_60 != 0) {
      while( true ) {
        bVar5 = false;
        if (*pbStack_60 != 0) {
          bVar5 = true;
          if ((*pbStack_60 != 0x20) && ((*pbStack_60 < 9 || (bVar5 = true, 10 < *pbStack_60)))) {
            bVar5 = *pbStack_60 == 0xd;
          }
          bVar5 = (bool)(bVar5 ^ 1);
        }
        if (!bVar5) break;
        pbStack_60 = pbStack_60 + 1;
      }
      bVar1 = *pbStack_60;
      *pbStack_60 = 0;
      pxVar4 = xmlGetDocEntity(doc,name_00);
      if (pxVar4 == (xmlEntityPtr)0x0) {
        xmlErrValidNode(ctxt,(xmlNodePtr)doc,XML_DTD_UNKNOWN_ENTITY,
                        "ENTITIES attribute %s reference an unknown entity \"%s\"\n",name,name_00,
                        (xmlChar *)0x0);
        ent._4_4_ = 0;
      }
      else if (pxVar4->etype != XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
        xmlErrValidNode(ctxt,(xmlNodePtr)doc,XML_DTD_ENTITY_TYPE,
                        "ENTITIES attribute %s reference an entity \"%s\" of wrong type\n",name,
                        name_00,(xmlChar *)0x0);
        ent._4_4_ = 0;
      }
      if (bVar1 == 0) break;
      *pbStack_60 = bVar1;
      while( true ) {
        bVar5 = true;
        if ((*pbStack_60 != 0x20) && ((*pbStack_60 < 9 || (bVar5 = true, 10 < *pbStack_60)))) {
          bVar5 = *pbStack_60 == 0xd;
        }
        if (!bVar5) break;
        pbStack_60 = pbStack_60 + 1;
      }
    }
    (*xmlFree)(pbVar3);
    break;
  case XML_ATTRIBUTE_NOTATION:
    local_78 = xmlGetDtdNotationDesc(doc->intSubset,value);
    if ((local_78 == (xmlNotationPtr)0x0) && (doc->extSubset != (_xmlDtd *)0x0)) {
      local_78 = xmlGetDtdNotationDesc(doc->extSubset,value);
    }
    if (local_78 == (xmlNotationPtr)0x0) {
      xmlErrValidNode(ctxt,(xmlNodePtr)doc,XML_DTD_UNKNOWN_NOTATION,
                      "NOTATION attribute %s reference an unknown notation \"%s\"\n",name,value,
                      (xmlChar *)0x0);
    }
    ent._4_4_ = (uint)(local_78 != (xmlNotationPtr)0x0);
  }
  return ent._4_4_;
}

Assistant:

static int
xmlValidateAttributeValue2(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
      const xmlChar *name, xmlAttributeType type, const xmlChar *value) {
    int ret = 1;
    switch (type) {
	case XML_ATTRIBUTE_IDREFS:
	case XML_ATTRIBUTE_IDREF:
	case XML_ATTRIBUTE_ID:
	case XML_ATTRIBUTE_NMTOKENS:
	case XML_ATTRIBUTE_ENUMERATION:
	case XML_ATTRIBUTE_NMTOKEN:
        case XML_ATTRIBUTE_CDATA:
	    break;
	case XML_ATTRIBUTE_ENTITY: {
	    xmlEntityPtr ent;

	    ent = xmlGetDocEntity(doc, value);
	    /* yeah it's a bit messy... */
	    if ((ent == NULL) && (doc->standalone == 1)) {
		doc->standalone = 0;
		ent = xmlGetDocEntity(doc, value);
	    }
	    if (ent == NULL) {
		xmlErrValidNode(ctxt, (xmlNodePtr) doc,
				XML_DTD_UNKNOWN_ENTITY,
   "ENTITY attribute %s reference an unknown entity \"%s\"\n",
		       name, value, NULL);
		ret = 0;
	    } else if (ent->etype != XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
		xmlErrValidNode(ctxt, (xmlNodePtr) doc,
				XML_DTD_ENTITY_TYPE,
   "ENTITY attribute %s reference an entity \"%s\" of wrong type\n",
		       name, value, NULL);
		ret = 0;
	    }
	    break;
        }
	case XML_ATTRIBUTE_ENTITIES: {
	    xmlChar *dup, *nam = NULL, *cur, save;
	    xmlEntityPtr ent;

	    dup = xmlStrdup(value);
	    if (dup == NULL)
		return(0);
	    cur = dup;
	    while (*cur != 0) {
		nam = cur;
		while ((*cur != 0) && (!IS_BLANK_CH(*cur))) cur++;
		save = *cur;
		*cur = 0;
		ent = xmlGetDocEntity(doc, nam);
		if (ent == NULL) {
		    xmlErrValidNode(ctxt, (xmlNodePtr) doc,
				    XML_DTD_UNKNOWN_ENTITY,
       "ENTITIES attribute %s reference an unknown entity \"%s\"\n",
			   name, nam, NULL);
		    ret = 0;
		} else if (ent->etype != XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
		    xmlErrValidNode(ctxt, (xmlNodePtr) doc,
				    XML_DTD_ENTITY_TYPE,
       "ENTITIES attribute %s reference an entity \"%s\" of wrong type\n",
			   name, nam, NULL);
		    ret = 0;
		}
		if (save == 0)
		    break;
		*cur = save;
		while (IS_BLANK_CH(*cur)) cur++;
	    }
	    xmlFree(dup);
	    break;
	}
	case XML_ATTRIBUTE_NOTATION: {
	    xmlNotationPtr nota;

	    nota = xmlGetDtdNotationDesc(doc->intSubset, value);
	    if ((nota == NULL) && (doc->extSubset != NULL))
		nota = xmlGetDtdNotationDesc(doc->extSubset, value);

	    if (nota == NULL) {
		xmlErrValidNode(ctxt, (xmlNodePtr) doc,
		                XML_DTD_UNKNOWN_NOTATION,
       "NOTATION attribute %s reference an unknown notation \"%s\"\n",
		       name, value, NULL);
		ret = 0;
	    }
	    break;
        }
    }
    return(ret);
}